

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * OpToStr_abi_cxx11_(int op)

{
  undefined4 in_ESI;
  string *in_RDI;
  allocator<char> *in_stack_ffffffffffffff90;
  allocator<char> *paVar1;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25;
  allocator<char> local_24;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  allocator<char> local_20;
  undefined1 local_1f [2];
  allocator<char> local_1d [16];
  allocator<char> local_d [13];
  
  switch(in_ESI) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(local_d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(local_1d);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)(local_1f + 1));
    break;
  case 4:
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)local_1f);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_25);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_24);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_26);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 9:
    paVar1 = &local_21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,paVar1);
    std::allocator<char>::~allocator(&local_21);
    break;
  case 10:
    paVar1 = &local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,(char *)paVar1,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_20);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_22);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(&local_23);
  }
  return in_RDI;
}

Assistant:

std::string OpToStr(int op)
{
    switch (op) {
    case ADD:
        return "+";
    case SUB:
        return "-";
    case MUL:
        return "*";
    case DIV:
        return "/";
    case COS:
        return "cos";
    case SIN:
        return "sin";
    case TAN:
        return "tan";
    case COT:
        return "cot";
    case EXP:
        return "exp";
    case PWR:
        return "^";
    case LOG:
        return "log";
    default:
        return "nil";
    }
}